

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Coxeter_triangulation.h
# Opt level: O1

Matrix * __thiscall
Gudhi::coxeter_triangulation::
Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
::root_matrix(Matrix *__return_storage_ptr__,
             Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             *this,uint d)

{
  undefined1 auVar1 [16];
  double *pdVar2;
  EigenvectorsType *pEVar3;
  undefined8 *puVar4;
  char *__function;
  undefined8 uVar5;
  ActualDstType actualDst;
  bool bVar6;
  long lVar7;
  double *pdVar8;
  double dVar9;
  VectorXd sqrt_diag;
  Matrix cartan;
  Matrix lower;
  SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> saes;
  assign_op<double,_double> local_d9;
  Matrix<double,__1,_1,_0,__1,_1> local_d8;
  Matrix<double,__1,__1,_0,__1,__1> local_c8;
  void *local_a8;
  double *pdStack_a0;
  long local_98;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_88;
  SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_70;
  
  pdVar8 = (double *)(ulong)d;
  local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  local_70.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = pdVar8;
  local_70.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = (Index)pdVar8;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<double,double>>
            (&local_c8,
             (CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)&local_70,(assign_op<double,_double> *)&local_a8);
  if (1 < d) {
    pdVar2 = local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data + 1;
    lVar7 = 1;
    do {
      if ((((local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows <= lVar7 + -1) ||
           (local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols <= lVar7)) ||
          (pdVar2[local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows + -1] = -0.5,
          local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
          <= lVar7)) ||
         (local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
          <= lVar7 + -1)) {
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                     );
      }
      *pdVar2 = -0.5;
      lVar7 = lVar7 + 1;
      pdVar2 = pdVar2 + local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_rows + 1;
    } while (d != (uint)lVar7);
  }
  Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  SelfAdjointEigenSolver<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((SelfAdjointEigenSolver<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_70,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_c8,0x80);
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  pdVar2 = local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (pdVar8 != (double *)0x0) {
    free((void *)0x0);
    if (d == 0) {
      local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      pdVar2 = local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
    }
    else {
      pdVar2 = (double *)malloc((long)pdVar8 * 8);
      if ((d != 1) && (((ulong)pdVar2 & 0xf) != 0)) {
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                      "void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      if (pdVar2 == (double *)0x0) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = operator_delete;
        __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
  }
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar2;
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)pdVar8;
  if (d != 0) {
    lVar7 = 0;
    do {
      if (local_70.m_isInitialized == false) {
        __assert_fail("m_isInitialized && \"SelfAdjointEigenSolver is not initialized.\"",
                      "/usr/include/eigen3/Eigen/src/Eigenvalues/SelfAdjointEigenSolver.h",0x12e,
                      "const RealVectorType &Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double, -1, -1>>::eigenvalues() const [_MatrixType = Eigen::Matrix<double, -1, -1>]"
                     );
      }
      if (local_70.m_eivalues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows <= lVar7) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xa3,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                     );
      }
      dVar9 = local_70.m_eivalues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data[lVar7];
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      if (local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          <= lVar7) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [lVar7] = dVar9;
      lVar7 = lVar7 + 1;
    } while (d != (uint)lVar7);
  }
  local_88.m_functor.m_other = 1.0;
  local_a8 = (void *)0x0;
  pdStack_a0 = (double *)0x0;
  local_98 = 0;
  local_88.m_rows.m_value = (long)pdVar8;
  local_88.m_cols.m_value = (long)pdVar8;
  Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_a8,&local_88,&local_d9);
  local_88.m_rows.m_value = (long)&local_a8;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator=
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a8,
             (EigenBase<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_> *)
             &local_88);
  pEVar3 = Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::eigenvectors
                     (&local_70);
  if (local_98 ==
      (pEVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows) {
    if ((double *)
        (pEVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
        == (double *)
           local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
    {
      if (pdStack_a0 !=
          (double *)
          local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
      {
        __assert_fail("rows() == cols()","/usr/include/eigen3/Eigen/src/LU/InverseImpl.h",0x15f,
                      "const Inverse<Derived> Eigen::MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>, Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, 1>>::inverse() const [Derived = Eigen::Product<Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>, Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, 1>]"
                     );
      }
      local_88.m_functor.m_other = (double)&local_d8;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
      m_storage.m_data = (double *)0x0;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
      m_storage.m_rows = 0;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
      m_storage.m_cols = 0;
      bVar6 = pdStack_a0 == (double *)0x0 ||
              (double *)
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows == (double *)0x0;
      local_88.m_cols.m_value = (long)pEVar3;
      if ((bVar6) ||
         (auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
         uVar5 = SUB168(auVar1 % SEXT816((long)pdStack_a0),0),
         local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
         SUB168(auVar1 / SEXT816((long)pdStack_a0),0))) {
        if ((long)((ulong)pdStack_a0 |
                  local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows) < 0) {
          local_88.m_rows.m_value = (long)&local_a8;
          __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                        "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                       );
        }
        if ((bVar6) ||
           (auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
           uVar5 = SUB168(auVar1 % SEXT816((long)pdStack_a0),0),
           local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
           <= SUB168(auVar1 / SEXT816((long)pdStack_a0),0))) {
          local_88.m_rows.m_value = (long)&local_a8;
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                    ((DenseStorage<double,__1,__1,__1,_0> *)__return_storage_ptr__,
                     (long)pdStack_a0 *
                     local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows,
                     local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows,(Index)pdStack_a0);
          Eigen::internal::
          Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Inverse<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
          ::run(__return_storage_ptr__,(SrcXprType *)&local_88,&local_d9);
          free(local_a8);
          free(local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
          free(local_70.m_hcoeffs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data);
          free(local_70.m_subdiag.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data);
          free(local_70.m_eivalues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data);
          free(local_70.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data);
          free(local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data);
          return __return_storage_ptr__;
        }
      }
      local_88.m_rows.m_value = (long)&local_a8;
      puVar4 = (undefined8 *)__cxa_allocate_exception(8,bVar6,uVar5);
      *puVar4 = operator_delete;
      __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    __function = 
    "Eigen::Product<Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>, Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, 1>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>, Rhs = Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Option = 1]"
    ;
  }
  else {
    __function = 
    "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
    ;
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,__function);
}

Assistant:

Matrix root_matrix(unsigned d) {
    Matrix cartan(Matrix::Identity(d, d));
    for (unsigned i = 1; i < d; i++) {
      cartan(i - 1, i) = -0.5;
      cartan(i, i - 1) = -0.5;
    }
    Eigen::SelfAdjointEigenSolver<Matrix> saes(cartan);
    Eigen::VectorXd sqrt_diag(d);
    for (unsigned i = 0; i < d; ++i) sqrt_diag(i) = std::sqrt(saes.eigenvalues()[i]);

    Matrix lower(Matrix::Ones(d, d));
    lower = lower.triangularView<Eigen::Lower>();

    Matrix result = (lower * saes.eigenvectors() * sqrt_diag.asDiagonal()).inverse();
    return result;
  }